

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O2

void __thiscall
re2c::DFA::emit(DFA *this,Output *output,uint32_t *ind,bool isLastCond,bool *bPrologBrace)

{
  counter_t<re2c::label_t> *this_00;
  State *pSVar1;
  pointer pbVar2;
  pointer pbVar3;
  BitMap *pBVar4;
  bool bVar5;
  label_t lVar6;
  opt_t *poVar7;
  OutputFile *pOVar8;
  Output *this_01;
  size_type sVar9;
  uint32_t uVar10;
  uint64_t n;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  long lVar12;
  byte bVar13;
  string *psVar14;
  uint cMax;
  State **ppSVar15;
  long lVar16;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  label_t local_cc;
  label_t start_label;
  uint32_t i;
  State **local_88;
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> used_labels;
  string local_50 [32];
  
  poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  bVar13 = bWroteCondCheck & poVar7->cFlag;
  this_00 = &(output->source).label_counter;
  local_cc = counter_t<re2c::label_t>::next(this_00);
  start_label = local_cc;
  if (bVar13 == 0) {
    poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar7->cFlag == true) {
      local_cc = counter_t<re2c::label_t>::next(this_00);
    }
  }
  ppSVar15 = &this->head;
  local_88 = ppSVar15;
  while (lVar6.value = start_label.value, pSVar1 = *ppSVar15, pSVar1 != (State *)0x0) {
    lVar6 = counter_t<re2c::label_t>::next(this_00);
    (pSVar1->label).value = lVar6.value;
    ppSVar15 = &pSVar1->next;
  }
  used_labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &used_labels._M_t._M_impl.super__Rb_tree_header._M_header;
  used_labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  used_labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  used_labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  used_labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       used_labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = OutputFile::get_force_start_label(&output->source);
  value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)bVar5;
  count_used_labels(this,&used_labels,lVar6,local_cc,bVar5);
  Action::set_initial(&(*local_88)->action,local_cc,((*local_88)->action).type == SAVE);
  Skeleton::warn_undefined_control_flow(this->skeleton);
  Skeleton::warn_unreachable_rules(this->skeleton);
  Skeleton::warn_match_empty(this->skeleton);
  poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (poVar7->target == SKELETON) {
    pVar17 = std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string_const&>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&output->skeletons,&this->name);
    if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      Skeleton::emit_data(this->skeleton,(output->source).file_name);
      Skeleton::emit_start
                (this->skeleton,&output->source,this->max_fill,this->need_backup,
                 this->need_backupctx,this->need_accept);
      i = 2;
      emit_body(this,&output->source,&i,&used_labels,local_cc);
      Skeleton::emit_end(this->skeleton,&output->source,this->need_backup,this->need_backupctx);
    }
    goto LAB_00129856;
  }
  if (bVar13 == 0) {
    pOVar8 = OutputFile::ws(&output->source,"\n");
    OutputFile::wdelay_line_info(pOVar8);
    poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar7->target == DOT) {
      *bPrologBrace = true;
      pcVar11 = "digraph re2c {\n";
      this_01 = output;
LAB_00128f45:
      OutputFile::ws(&this_01->source,pcVar11);
    }
    else {
      poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if (poVar7->fFlag == false) {
        bVar5 = OutputFile::get_used_yyaccept(&output->source);
        if (!bVar5) goto LAB_00128e1c;
LAB_00128f1f:
        *bPrologBrace = true;
        uVar10 = *ind;
        *ind = uVar10 + 1;
        this_01 = (Output *)OutputFile::wind(&output->source,uVar10);
        pcVar11 = "{\n";
        goto LAB_00128f45;
      }
LAB_00128e1c:
      poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if (poVar7->fFlag == false) {
        poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        if (poVar7->bEmitYYCh != false) goto LAB_00128f1f;
      }
      poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if (poVar7->bFlag == true) {
        poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        if ((poVar7->cFlag == false) && (BitMap::first != (BitMap *)0x0)) goto LAB_00128f1f;
      }
      poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if ((poVar7->cFlag == true) && (bWroteCondCheck == 0)) {
        poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        if (poVar7->gFlag != false) goto LAB_00128f1f;
      }
      poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if ((poVar7->fFlag == true) && (bWroteGetState == '\0')) {
        poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        if (poVar7->gFlag == true) goto LAB_00128f1f;
      }
      if (*ind == 0) {
        *ind = 1;
      }
    }
    poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar7->fFlag == false) {
      poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if (poVar7->target != DOT) {
        poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        if (poVar7->bEmitYYCh == true) {
          pOVar8 = OutputFile::wind(&output->source,*ind);
          poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
          pOVar8 = OutputFile::wstring(pOVar8,&poVar7->yyctype);
          pOVar8 = OutputFile::ws(pOVar8," ");
          poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
          pOVar8 = OutputFile::wstring(pOVar8,&poVar7->yych);
          OutputFile::ws(pOVar8,";\n");
        }
        OutputFile::wdelay_yyaccept_init(&output->source,*ind);
        goto LAB_0012902e;
      }
    }
    OutputFile::ws(&output->source,"\n");
  }
LAB_0012902e:
  poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (poVar7->bFlag == true) {
    poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if ((poVar7->cFlag == false) && (BitMap::first != (BitMap *)0x0)) {
      uVar10 = 0x100;
      if (this->ubChar < 0x100) {
        uVar10 = this->ubChar;
      }
      BitMap::gen(&output->source,*ind,this->lbChar,uVar10);
    }
  }
  if (bVar13 == 0) {
    poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if ((poVar7->cFlag == true) && (bWroteCondCheck == 0)) {
      poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if (poVar7->gFlag == true) {
        uVar10 = *ind;
        pbVar2 = (output->types).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar3 = (output->types).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pOVar8 = OutputFile::wind(&output->source,uVar10);
        pOVar8 = OutputFile::ws(pOVar8,"static void *");
        poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        pOVar8 = OutputFile::wstring(pOVar8,&poVar7->yyctable);
        pOVar8 = OutputFile::ws(pOVar8,"[");
        n = (long)pbVar2 - (long)pbVar3 >> 5;
        pOVar8 = OutputFile::wu64(pOVar8,n);
        OutputFile::ws(pOVar8,"] = {\n");
        lVar12 = 0;
        while (bVar5 = n != 0, n = n - 1, bVar5) {
          pOVar8 = OutputFile::wind(&output->source,uVar10 + 1);
          pOVar8 = OutputFile::ws(pOVar8,"&&");
          poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
          pOVar8 = OutputFile::wstring(pOVar8,&poVar7->condPrefix);
          pOVar8 = OutputFile::wstring(pOVar8,(string *)
                                              ((long)&(((output->types).
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar12));
          OutputFile::ws(pOVar8,",\n");
          lVar12 = lVar12 + 0x20;
        }
        pOVar8 = OutputFile::wind(&output->source,uVar10);
        OutputFile::ws(pOVar8,"};\n");
      }
    }
    OutputFile::wdelay_state_goto(&output->source,*ind);
    poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar7->cFlag == true) {
      poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if (poVar7->target != DOT) {
        sVar9 = std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::
                count(&used_labels,&start_label);
        if (sVar9 != 0) {
          poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
          pOVar8 = OutputFile::wstring(&output->source,&poVar7->labelPrefix);
          pOVar8 = OutputFile::wlabel(pOVar8,start_label);
          OutputFile::ws(pOVar8,":\n");
        }
      }
    }
    OutputFile::wuser_start_label(&output->source);
    poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if ((poVar7->cFlag == true) && (bWroteCondCheck == 0)) {
      uVar10 = *ind;
      lVar12 = (long)(output->types).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(output->types).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      lVar16 = lVar12 >> 5;
      if (poVar7->target == DOT) {
        (output->source).warn_condition_order = false;
        lVar12 = 0;
        while (bVar5 = lVar16 != 0, lVar16 = lVar16 + -1, bVar5) {
          std::__cxx11::string::string
                    ((string *)&i,
                     (string *)
                     ((long)&(((output->types).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar12));
          pOVar8 = OutputFile::ws(&output->source,"0 -> ");
          pOVar8 = OutputFile::wstring(pOVar8,(string *)&i);
          pOVar8 = OutputFile::ws(pOVar8," [label=\"state=");
          pOVar8 = OutputFile::wstring(pOVar8,(string *)&i);
          OutputFile::ws(pOVar8,"\"]\n");
          std::__cxx11::string::~string((string *)&i);
          lVar12 = lVar12 + 0x20;
        }
      }
      else {
        poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        if (poVar7->gFlag == true) {
          pOVar8 = OutputFile::wind(&output->source,uVar10);
          pOVar8 = OutputFile::ws(pOVar8,"goto *");
          poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
          pOVar8 = OutputFile::wstring(pOVar8,&poVar7->yyctable);
          pOVar8 = OutputFile::ws(pOVar8,"[");
          genGetCondition_abi_cxx11_();
          pOVar8 = OutputFile::wstring(pOVar8,(string *)&i);
          OutputFile::ws(pOVar8,"];\n");
          std::__cxx11::string::~string((string *)&i);
        }
        else {
          poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
          if (poVar7->sFlag == true) {
            if (lVar12 == 0x20) {
              (output->source).warn_condition_order = false;
            }
            cMax = (int)lVar16 - 1;
            value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)cMax
            ;
            genCondGotoSub(&output->source,uVar10,&output->types,0,cMax);
          }
          else {
            (output->source).warn_condition_order = false;
            pOVar8 = OutputFile::wind(&output->source,uVar10);
            pOVar8 = OutputFile::ws(pOVar8,"switch (");
            genGetCondition_abi_cxx11_();
            pOVar8 = OutputFile::wstring(pOVar8,(string *)&i);
            OutputFile::ws(pOVar8,") {\n");
            std::__cxx11::string::~string((string *)&i);
            lVar12 = 0;
            while (bVar5 = lVar16 != 0, lVar16 = lVar16 + -1, bVar5) {
              psVar14 = (string *)
                        ((long)&(((output->types).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar12);
              pOVar8 = OutputFile::wind(&output->source,uVar10);
              pOVar8 = OutputFile::ws(pOVar8,"case ");
              poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
              pOVar8 = OutputFile::wstring(pOVar8,&poVar7->condEnumPrefix);
              pOVar8 = OutputFile::wstring(pOVar8,psVar14);
              pOVar8 = OutputFile::ws(pOVar8,": goto ");
              poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
              pOVar8 = OutputFile::wstring(pOVar8,&poVar7->condPrefix);
              pOVar8 = OutputFile::wstring(pOVar8,psVar14);
              OutputFile::ws(pOVar8,";\n");
              lVar12 = lVar12 + 0x20;
            }
            pOVar8 = OutputFile::wind(&output->source,uVar10);
            OutputFile::ws(pOVar8,"}\n");
          }
        }
      }
      OutputFile::wdelay_warn_condition_order(&output->source);
      bWroteCondCheck = 1;
    }
  }
  poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if ((poVar7->cFlag == true) && ((this->cond)._M_string_length != 0)) {
    poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    psVar14 = &this->cond;
    if ((poVar7->condDivider)._M_string_length != 0) {
      poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      std::__cxx11::string::string(local_50,(string *)&poVar7->condDivider);
      poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      replaceParam<std::__cxx11::string>
                ((string *)&i,(re2c *)local_50,&poVar7->condDividerParam,psVar14,value);
      pOVar8 = OutputFile::wstring(&output->source,(string *)&i);
      OutputFile::ws(pOVar8,"\n");
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::string::~string(local_50);
    }
    poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar7->target == DOT) {
      pOVar8 = OutputFile::wstring(&output->source,psVar14);
      pOVar8 = OutputFile::ws(pOVar8," -> ");
      pOVar8 = OutputFile::wlabel(pOVar8,(label_t)((*local_88)->label).value);
      pcVar11 = "\n";
    }
    else {
      poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      pOVar8 = OutputFile::wstring(&output->source,&poVar7->condPrefix);
      pOVar8 = OutputFile::wstring(pOVar8,psVar14);
      pcVar11 = ":\n";
    }
    OutputFile::ws(pOVar8,pcVar11);
  }
  poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (poVar7->cFlag == true) {
    poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if ((poVar7->bFlag == true) && (BitMap::first != (BitMap *)0x0)) {
      uVar10 = *ind;
      *ind = uVar10 + 1;
      pOVar8 = OutputFile::wind(&output->source,uVar10);
      OutputFile::ws(pOVar8,"{\n");
      uVar10 = 0x100;
      if (this->ubChar < 0x100) {
        uVar10 = this->ubChar;
      }
      BitMap::gen(&output->source,*ind,this->lbChar,uVar10);
    }
  }
  emit_body(this,&output->source,ind,&used_labels,local_cc);
  poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (poVar7->cFlag == true) {
    poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if ((poVar7->bFlag == true) && (BitMap::first != (BitMap *)0x0)) {
      uVar10 = *ind;
      *ind = uVar10 - 1;
      pOVar8 = OutputFile::wind(&output->source,uVar10 - 1);
      OutputFile::ws(pOVar8,"}\n");
    }
  }
  poVar7 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (((byte)(poVar7->cFlag ^ 1U | isLastCond) == 1) && (*bPrologBrace == true)) {
    uVar10 = *ind;
    *ind = uVar10 - 1;
    pOVar8 = OutputFile::wind(&output->source,uVar10 - 1);
    OutputFile::ws(pOVar8,"}\n");
  }
LAB_00129856:
  pBVar4 = BitMap::first;
  if (BitMap::first != (BitMap *)0x0) {
    BitMap::~BitMap(BitMap::first);
    operator_delete(pBVar4,0x20);
    BitMap::first = (BitMap *)0x0;
  }
  std::
  _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
  ::~_Rb_tree(&used_labels._M_t);
  return;
}

Assistant:

void DFA::emit(Output & output, uint32_t& ind, bool isLastCond, bool& bPrologBrace)
{
	OutputFile & o = output.source;

	bool bProlog = (!opts->cFlag || !bWroteCondCheck);

	// start_label points to the beginning of current re2c block
	// (prior to condition dispatch in '-c' mode)
	// it can forced by configuration 're2c:startlabel = <integer>;'
	label_t start_label = o.label_counter.next ();
	// initial_label points to the beginning of DFA
	// in '-c' mode this is NOT equal to start_label
	label_t initial_label = bProlog && opts->cFlag
		? o.label_counter.next ()
		: start_label;
	for (State * s = head; s; s = s->next)
	{
		s->label = o.label_counter.next ();
	}
	std::set<label_t> used_labels;
	count_used_labels (used_labels, start_label, initial_label, o.get_force_start_label ());

	head->action.set_initial (initial_label, head->action.type == Action::SAVE);

	skeleton->warn_undefined_control_flow ();
	skeleton->warn_unreachable_rules ();
	skeleton->warn_match_empty ();

	if (opts->target == opt_t::SKELETON)
	{
		if (output.skeletons.insert (name).second)
		{
			skeleton->emit_data (o.file_name);
			skeleton->emit_start (o, max_fill, need_backup, need_backupctx, need_accept);
			uint32_t i = 2;
			emit_body (o, i, used_labels, initial_label);
			skeleton->emit_end (o, need_backup, need_backupctx);
		}
	}
	else
	{
		// Generate prolog
		if (bProlog)
		{
			o.ws("\n").wdelay_line_info ();
			if (opts->target == opt_t::DOT)
			{
				bPrologBrace = true;
				o.ws("digraph re2c {\n");
			}
			else if ((!opts->fFlag && o.get_used_yyaccept ())
			||  (!opts->fFlag && opts->bEmitYYCh)
			||  (opts->bFlag && !opts->cFlag && BitMap::first)
			||  (opts->cFlag && !bWroteCondCheck && opts->gFlag)
			||  (opts->fFlag && !bWroteGetState && opts->gFlag)
			)
			{
				bPrologBrace = true;
				o.wind(ind++).ws("{\n");
			}
			else if (ind == 0)
			{
				ind = 1;
			}
			if (!opts->fFlag && opts->target != opt_t::DOT)
			{
				if (opts->bEmitYYCh)
				{
					o.wind(ind).wstring(opts->yyctype).ws(" ").wstring(opts->yych).ws(";\n");
				}
				o.wdelay_yyaccept_init (ind);
			}
			else
			{
				o.ws("\n");
			}
		}
		if (opts->bFlag && !opts->cFlag && BitMap::first)
		{
			BitMap::gen(o, ind, lbChar, ubChar <= 256 ? ubChar : 256);
		}
		if (bProlog)
		{
			if (opts->cFlag && !bWroteCondCheck && opts->gFlag)
			{
				genCondTable(o, ind, output.types);
			}
			o.wdelay_state_goto (ind);
			if (opts->cFlag && opts->target != opt_t::DOT)
			{
				if (used_labels.count(start_label))
				{
					o.wstring(opts->labelPrefix).wlabel(start_label).ws(":\n");
				}
			}
			o.wuser_start_label ();
			if (opts->cFlag && !bWroteCondCheck)
			{
				genCondGoto(o, ind, output.types);
			}
		}
		if (opts->cFlag && !cond.empty())
		{
			if (opts->condDivider.length())
			{
				o.wstring(replaceParam(opts->condDivider, opts->condDividerParam, cond)).ws("\n");
			}
			if (opts->target == opt_t::DOT)
			{
				o.wstring(cond).ws(" -> ").wlabel(head->label).ws("\n");
			}
			else
			{
				o.wstring(opts->condPrefix).wstring(cond).ws(":\n");
			}
		}
		if (opts->cFlag && opts->bFlag && BitMap::first)
		{
			o.wind(ind++).ws("{\n");
			BitMap::gen(o, ind, lbChar, ubChar <= 256 ? ubChar : 256);
		}
		// Generate code
		emit_body (o, ind, used_labels, initial_label);
		if (opts->cFlag && opts->bFlag && BitMap::first)
		{
			o.wind(--ind).ws("}\n");
		}
		// Generate epilog
		if ((!opts->cFlag || isLastCond) && bPrologBrace)
		{
			o.wind(--ind).ws("}\n");
		}
	}

	// Cleanup
	if (BitMap::first)
	{
		delete BitMap::first;
		BitMap::first = NULL;
	}
}